

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int *piVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int nn;
  uint uVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  int nn_1;
  int iVar21;
  long lVar22;
  ulong uVar23;
  _func_int ***ppp_Var24;
  void **ppvVar25;
  char cVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  undefined1 (*pauVar31) [32];
  undefined1 (*pauVar32) [32];
  int iVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float zeros [8];
  undefined1 local_c8 [64];
  size_t local_88;
  ulong local_80;
  ulong local_78;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  void *local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  lVar22 = (long)(int)uVar3;
  local_78 = (ulong)uVar3;
  iVar21 = bottom_im2col->h;
  uVar28 = bottom_im2col->c;
  uVar19 = (ulong)uVar28;
  local_80 = (ulong)top_blob->c;
  local_88 = 0;
  local_c8._0_8_ = (Allocator *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8._24_4_ = 0;
  local_c8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_c8._32_8_ = local_c8._0_8_;
  local_c8._40_4_ = local_c8._8_4_;
  local_c8._44_4_ = local_c8._12_4_;
  local_70 = top_blob;
  local_68 = _bias;
  if (lVar22 < 8) {
    uVar15 = (uVar3 & 3) + 1;
    iVar33 = iVar21 * 4;
    if ((int)uVar3 < 4) {
      uVar15 = uVar3;
      iVar33 = iVar21;
    }
    Mat::create((Mat *)local_c8,iVar33,uVar28,uVar15,0x20,8,(Allocator *)opt);
    uVar15 = uVar3 + 7;
    if (-1 < (int)uVar3) {
      uVar15 = uVar3;
    }
    uVar15 = (int)uVar15 >> 3;
  }
  else {
    Mat::create((Mat *)local_c8,iVar21 * 8,uVar28,
                (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0),0x20,8,(Allocator *)opt);
    uVar15 = uVar3 >> 3;
    lVar17 = 0x80;
    uVar23 = 0;
    do {
      if (0 < (int)uVar28) {
        ppp_Var24 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ + local_88 * uVar23 * local_c8._16_8_);
        uVar29 = 0;
        do {
          if (0 < iVar21) {
            pauVar31 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + lVar17);
            iVar33 = iVar21;
            do {
              auVar42 = vunpcklps_avx(pauVar31[-4],pauVar31[-3]);
              auVar69 = vunpckhps_avx(pauVar31[-4],pauVar31[-3]);
              auVar56 = vunpcklps_avx(pauVar31[-2],pauVar31[-1]);
              auVar47 = vunpckhps_avx(pauVar31[-2],pauVar31[-1]);
              auVar48 = vunpcklps_avx(*pauVar31,pauVar31[1]);
              auVar65 = vunpckhps_avx(*pauVar31,pauVar31[1]);
              auVar64 = vunpcklps_avx(pauVar31[2],pauVar31[3]);
              auVar67 = vunpckhps_avx(pauVar31[2],pauVar31[3]);
              auVar59 = vunpcklpd_avx(auVar42,auVar56);
              auVar42 = vunpckhpd_avx(auVar42,auVar56);
              auVar56 = vunpcklpd_avx(auVar69,auVar47);
              auVar69 = vunpckhpd_avx(auVar69,auVar47);
              auVar60 = vunpcklpd_avx(auVar48,auVar64);
              auVar47 = vunpckhpd_avx(auVar48,auVar64);
              auVar48 = vunpcklpd_avx(auVar65,auVar67);
              auVar65 = vunpckhpd_avx(auVar65,auVar67);
              auVar64._16_16_ = auVar60._0_16_;
              auVar64._0_16_ = auVar59._0_16_;
              auVar70._16_16_ = auVar47._0_16_;
              auVar70._0_16_ = auVar42._0_16_;
              auVar75._16_16_ = auVar48._0_16_;
              auVar75._0_16_ = auVar56._0_16_;
              auVar76._16_16_ = auVar65._0_16_;
              auVar76._0_16_ = auVar69._0_16_;
              auVar67 = vperm2f128_avx(auVar59,auVar60,0x31);
              auVar42 = vperm2f128_avx(auVar42,auVar47,0x31);
              auVar47 = vperm2f128_avx(auVar56,auVar48,0x31);
              auVar69 = vperm2f128_avx(auVar69,auVar65,0x31);
              *(undefined1 (*) [32])ppp_Var24 = auVar64;
              *(undefined1 (*) [32])(ppp_Var24 + 4) = auVar70;
              *(undefined1 (*) [32])(ppp_Var24 + 8) = auVar75;
              *(undefined1 (*) [32])(ppp_Var24 + 0xc) = auVar76;
              *(undefined1 (*) [32])(ppp_Var24 + 0x10) = auVar67;
              *(undefined1 (*) [32])(ppp_Var24 + 0x14) = auVar42;
              *(undefined1 (*) [32])(ppp_Var24 + 0x18) = auVar47;
              *(undefined1 (*) [32])(ppp_Var24 + 0x1c) = auVar69;
              ppp_Var24 = ppp_Var24 + 0x20;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + (ulong)(uVar3 * 8) * 4);
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar19);
      }
      uVar23 = uVar23 + 1;
      lVar17 = lVar17 + 0x100;
    } while (uVar23 != uVar15);
  }
  iVar33 = uVar15 * 8;
  uVar15 = uVar3 + uVar15 * -8;
  uVar27 = (int)uVar15 >> 2;
  if (0 < (int)uVar27) {
    lVar17 = (long)iVar33 * 0x20 + 0x60;
    uVar23 = 0;
    do {
      if (0 < (int)uVar28) {
        uVar30 = iVar33 + (int)uVar23 * 4;
        uVar34 = iVar33 + (int)uVar23 * 4 + 7;
        if (-1 < (int)uVar30) {
          uVar34 = uVar30;
        }
        ppp_Var24 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ +
                    (long)(((int)uVar34 >> 3) + ((int)(uVar30 - (uVar34 & 0xfffffff8)) >> 2)) *
                    local_88 * local_c8._16_8_);
        uVar29 = 0;
        do {
          if (0 < iVar21) {
            pauVar31 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + lVar17);
            iVar36 = iVar21;
            do {
              auVar42 = vunpcklps_avx(pauVar31[-3],pauVar31[-2]);
              auVar69 = vunpckhps_avx(pauVar31[-3],pauVar31[-2]);
              auVar67 = vunpcklps_avx(pauVar31[-1],*pauVar31);
              auVar47 = vunpckhps_avx(pauVar31[-1],*pauVar31);
              auVar65 = vunpcklpd_avx(auVar42,auVar67);
              auVar42 = vunpckhpd_avx(auVar42,auVar67);
              auVar67 = vunpcklpd_avx(auVar69,auVar47);
              auVar69 = vunpckhpd_avx(auVar69,auVar47);
              auVar47._16_16_ = auVar42._0_16_;
              auVar47._0_16_ = auVar65._0_16_;
              auVar59._16_16_ = auVar69._0_16_;
              auVar59._0_16_ = auVar67._0_16_;
              auVar42 = vperm2f128_avx(auVar65,auVar42,0x31);
              auVar69 = vperm2f128_avx(auVar67,auVar69,0x31);
              *(undefined1 (*) [32])ppp_Var24 = auVar47;
              *(undefined1 (*) [32])(ppp_Var24 + 4) = auVar59;
              *(undefined1 (*) [32])(ppp_Var24 + 8) = auVar42;
              *(undefined1 (*) [32])(ppp_Var24 + 0xc) = auVar69;
              ppp_Var24 = ppp_Var24 + 0x10;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + (long)(int)(uVar3 * 8) * 4);
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar19);
      }
      uVar23 = uVar23 + 1;
      lVar17 = lVar17 + 0x80;
    } while (uVar23 != uVar27);
  }
  iVar33 = (uVar15 & 0xfffffffc) + iVar33;
  if (iVar33 < (int)local_78) {
    lVar17 = (long)iVar33;
    lVar18 = lVar17 << 5;
    do {
      if (0 < (int)uVar28) {
        uVar15 = (uint)lVar17;
        uVar27 = uVar15 + 3;
        if (-1 < (int)uVar15) {
          uVar27 = uVar15;
        }
        uVar34 = uVar15 + 7;
        if (-1 < (int)uVar15) {
          uVar34 = uVar15;
        }
        cVar26 = (char)lVar17 - ((byte)uVar34 & 0xf8);
        ppp_Var24 = (_func_int ***)
                    ((long)(_func_int ***)local_c8._0_8_ +
                    (long)(int)((int)((char)(((byte)(cVar26 >> 7) >> 6) + cVar26) >> 2) +
                               ((int)uVar34 >> 3) + (uVar15 - (uVar27 & 0xfffffffc))) * local_88 *
                    local_c8._16_8_);
        uVar23 = 0;
        do {
          if (0 < iVar21) {
            pauVar31 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar18);
            iVar33 = iVar21;
            do {
              *(undefined1 (*) [32])ppp_Var24 = *pauVar31;
              ppp_Var24 = ppp_Var24 + 4;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + (long)(int)(uVar3 * 8) * 4);
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar19);
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar17 < lVar22);
  }
  uVar15 = (int)local_80 >> 1;
  if (0 < (int)uVar15) {
    iVar33 = uVar28 * iVar21;
    iVar36 = iVar33 * 8;
    local_60 = (ulong)uVar15;
    uVar19 = 0;
    do {
      pauVar31 = (undefined1 (*) [32])
                 (uVar19 * 2 * local_70->cstep * local_70->elemsize + (long)local_70->data);
      pauVar32 = (undefined1 (*) [32])
                 ((uVar19 * 2 + 1) * local_70->cstep * local_70->elemsize + (long)local_70->data);
      ppvVar25 = &local_68->data + uVar19 * 4;
      if (local_68 == (Mat *)0x0) {
        ppvVar25 = &local_58;
      }
      local_58 = (void *)0x0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)local_78 < 8) {
        uVar23 = 0;
      }
      else {
        lVar17 = 0;
        uVar29 = 0;
        do {
          auVar42 = *(undefined1 (*) [32])ppvVar25;
          auVar69 = auVar42;
          auVar65 = auVar42;
          auVar67 = auVar42;
          auVar56 = auVar42;
          auVar60 = auVar42;
          auVar48 = auVar42;
          auVar52 = auVar42;
          if (0 < iVar33 * 8) {
            lVar35 = local_88 * local_c8._16_8_ * lVar17;
            lVar18 = 0;
            auVar47 = auVar42;
            iVar37 = iVar36;
            auVar59 = auVar42;
            auVar64 = auVar42;
            auVar70 = auVar42;
            auVar75 = auVar42;
            auVar76 = auVar42;
            auVar71 = auVar42;
            auVar72 = auVar42;
            do {
              pfVar16 = (float *)((long)kernel->data +
                                 lVar18 + kernel->cstep * uVar19 * kernel->elemsize);
              fVar4 = *pfVar16;
              fVar5 = pfVar16[1];
              fVar6 = pfVar16[2];
              fVar7 = pfVar16[3];
              fVar8 = pfVar16[4];
              fVar9 = pfVar16[5];
              fVar10 = pfVar16[6];
              fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar18 + lVar35);
              fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar18 + lVar35 + 4);
              auVar42._0_4_ = fVar1 * fVar4 + auVar47._0_4_;
              auVar42._4_4_ = fVar1 * fVar5 + auVar47._4_4_;
              auVar42._8_4_ = fVar1 * fVar6 + auVar47._8_4_;
              auVar42._12_4_ = fVar1 * fVar7 + auVar47._12_4_;
              auVar42._16_4_ = fVar1 * fVar8 + auVar47._16_4_;
              auVar42._20_4_ = fVar1 * fVar9 + auVar47._20_4_;
              auVar42._24_4_ = fVar1 * fVar10 + auVar47._24_4_;
              auVar42._28_4_ = fVar1 + auVar47._28_4_;
              auVar69._0_4_ = fVar2 * fVar4 + auVar72._0_4_;
              auVar69._4_4_ = fVar2 * fVar5 + auVar72._4_4_;
              auVar69._8_4_ = fVar2 * fVar6 + auVar72._8_4_;
              auVar69._12_4_ = fVar2 * fVar7 + auVar72._12_4_;
              auVar69._16_4_ = fVar2 * fVar8 + auVar72._16_4_;
              auVar69._20_4_ = fVar2 * fVar9 + auVar72._20_4_;
              auVar69._24_4_ = fVar2 * fVar10 + auVar72._24_4_;
              auVar69._28_4_ = fVar1 + auVar72._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar18 + lVar35);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar18 + lVar35 + 4);
              auVar65._0_4_ = fVar1 * fVar4 + auVar76._0_4_;
              auVar65._4_4_ = fVar1 * fVar5 + auVar76._4_4_;
              auVar65._8_4_ = fVar1 * fVar6 + auVar76._8_4_;
              auVar65._12_4_ = fVar1 * fVar7 + auVar76._12_4_;
              auVar65._16_4_ = fVar1 * fVar8 + auVar76._16_4_;
              auVar65._20_4_ = fVar1 * fVar9 + auVar76._20_4_;
              auVar65._24_4_ = fVar1 * fVar10 + auVar76._24_4_;
              auVar65._28_4_ = fVar1 + auVar76._28_4_;
              auVar67._0_4_ = fVar2 * fVar4 + auVar71._0_4_;
              auVar67._4_4_ = fVar2 * fVar5 + auVar71._4_4_;
              auVar67._8_4_ = fVar2 * fVar6 + auVar71._8_4_;
              auVar67._12_4_ = fVar2 * fVar7 + auVar71._12_4_;
              auVar67._16_4_ = fVar2 * fVar8 + auVar71._16_4_;
              auVar67._20_4_ = fVar2 * fVar9 + auVar71._20_4_;
              auVar67._24_4_ = fVar2 * fVar10 + auVar71._24_4_;
              auVar67._28_4_ = fVar1 + auVar71._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar18 + lVar35);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar18 + lVar35 + 4);
              auVar56._0_4_ = fVar1 * fVar4 + auVar70._0_4_;
              auVar56._4_4_ = fVar1 * fVar5 + auVar70._4_4_;
              auVar56._8_4_ = fVar1 * fVar6 + auVar70._8_4_;
              auVar56._12_4_ = fVar1 * fVar7 + auVar70._12_4_;
              auVar56._16_4_ = fVar1 * fVar8 + auVar70._16_4_;
              auVar56._20_4_ = fVar1 * fVar9 + auVar70._20_4_;
              auVar56._24_4_ = fVar1 * fVar10 + auVar70._24_4_;
              auVar56._28_4_ = fVar1 + auVar70._28_4_;
              auVar60._0_4_ = fVar2 * fVar4 + auVar75._0_4_;
              auVar60._4_4_ = fVar2 * fVar5 + auVar75._4_4_;
              auVar60._8_4_ = fVar2 * fVar6 + auVar75._8_4_;
              auVar60._12_4_ = fVar2 * fVar7 + auVar75._12_4_;
              auVar60._16_4_ = fVar2 * fVar8 + auVar75._16_4_;
              auVar60._20_4_ = fVar2 * fVar9 + auVar75._20_4_;
              auVar60._24_4_ = fVar2 * fVar10 + auVar75._24_4_;
              auVar60._28_4_ = fVar1 + auVar75._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar18 + lVar35);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar18 + lVar35 + 4);
              auVar48._0_4_ = fVar1 * fVar4 + auVar59._0_4_;
              auVar48._4_4_ = fVar1 * fVar5 + auVar59._4_4_;
              auVar48._8_4_ = fVar1 * fVar6 + auVar59._8_4_;
              auVar48._12_4_ = fVar1 * fVar7 + auVar59._12_4_;
              auVar48._16_4_ = fVar1 * fVar8 + auVar59._16_4_;
              auVar48._20_4_ = fVar1 * fVar9 + auVar59._20_4_;
              auVar48._24_4_ = fVar1 * fVar10 + auVar59._24_4_;
              auVar48._28_4_ = fVar1 + auVar59._28_4_;
              auVar52._0_4_ = fVar2 * fVar4 + auVar64._0_4_;
              auVar52._4_4_ = fVar2 * fVar5 + auVar64._4_4_;
              auVar52._8_4_ = fVar2 * fVar6 + auVar64._8_4_;
              auVar52._12_4_ = fVar2 * fVar7 + auVar64._12_4_;
              auVar52._16_4_ = fVar2 * fVar8 + auVar64._16_4_;
              auVar52._20_4_ = fVar2 * fVar9 + auVar64._20_4_;
              auVar52._24_4_ = fVar2 * fVar10 + auVar64._24_4_;
              auVar52._28_4_ = pfVar16[7] + auVar64._28_4_;
              lVar18 = lVar18 + 0x20;
              iVar37 = iVar37 + -1;
              auVar47 = auVar42;
              auVar59 = auVar48;
              auVar64 = auVar52;
              auVar70 = auVar56;
              auVar75 = auVar60;
              auVar76 = auVar65;
              auVar71 = auVar67;
              auVar72 = auVar69;
            } while (iVar37 != 0);
          }
          auVar71._16_16_ = auVar69._0_16_;
          auVar71._0_16_ = auVar42._0_16_;
          *pauVar31 = auVar71;
          auVar72._16_16_ = auVar67._0_16_;
          auVar72._0_16_ = auVar65._0_16_;
          pauVar31[1] = auVar72;
          auVar73._16_16_ = auVar60._0_16_;
          auVar73._0_16_ = auVar56._0_16_;
          pauVar31[2] = auVar73;
          auVar74._16_16_ = auVar52._0_16_;
          auVar74._0_16_ = auVar48._0_16_;
          pauVar31[3] = auVar74;
          auVar42 = vperm2f128_avx(auVar42,auVar69,0x31);
          *pauVar32 = auVar42;
          auVar42 = vperm2f128_avx(auVar65,auVar67,0x31);
          pauVar32[1] = auVar42;
          auVar42 = vperm2f128_avx(auVar56,auVar60,0x31);
          pauVar32[2] = auVar42;
          auVar42 = vperm2f128_avx(auVar48,auVar52,0x31);
          pauVar32[3] = auVar42;
          pauVar31 = pauVar31 + 4;
          pauVar32 = pauVar32 + 4;
          uVar23 = uVar29 + 8;
          lVar18 = uVar29 + 0xf;
          lVar17 = lVar17 + 1;
          uVar29 = uVar23;
        } while (lVar18 < lVar22);
      }
      if ((int)((uint)uVar23 | 3) < (int)uVar3) {
        uVar15 = 0;
        do {
          auVar53 = *(undefined1 (*) [32])ppvVar25;
          iVar37 = (int)uVar23;
          auVar43 = auVar53;
          auVar57 = auVar53;
          auVar49 = auVar53;
          if (0 < iVar33 * 8) {
            lVar17 = local_88 * local_c8._16_8_ *
                     (ulong)((uVar15 & 1) + ((uint)(uVar23 >> 3) & 0x1fffffff));
            lVar18 = 0;
            auVar42 = auVar53;
            auVar69 = auVar53;
            iVar38 = iVar36;
            auVar47 = auVar53;
            auVar65 = auVar53;
            do {
              pfVar16 = (float *)((long)kernel->data +
                                 lVar18 * 2 + kernel->cstep * uVar19 * kernel->elemsize);
              fVar4 = *pfVar16;
              fVar5 = pfVar16[1];
              fVar6 = pfVar16[2];
              fVar7 = pfVar16[3];
              fVar8 = pfVar16[4];
              fVar9 = pfVar16[5];
              fVar10 = pfVar16[6];
              fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar18 + lVar17);
              fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar18 + lVar17 + 4);
              auVar57._0_4_ = fVar1 * fVar4 + auVar65._0_4_;
              auVar57._4_4_ = fVar1 * fVar5 + auVar65._4_4_;
              auVar57._8_4_ = fVar1 * fVar6 + auVar65._8_4_;
              auVar57._12_4_ = fVar1 * fVar7 + auVar65._12_4_;
              auVar57._16_4_ = fVar1 * fVar8 + auVar65._16_4_;
              auVar57._20_4_ = fVar1 * fVar9 + auVar65._20_4_;
              auVar57._24_4_ = fVar1 * fVar10 + auVar65._24_4_;
              auVar57._28_4_ = fVar1 + auVar65._28_4_;
              auVar53._0_4_ = fVar2 * fVar4 + auVar69._0_4_;
              auVar53._4_4_ = fVar2 * fVar5 + auVar69._4_4_;
              auVar53._8_4_ = fVar2 * fVar6 + auVar69._8_4_;
              auVar53._12_4_ = fVar2 * fVar7 + auVar69._12_4_;
              auVar53._16_4_ = fVar2 * fVar8 + auVar69._16_4_;
              auVar53._20_4_ = fVar2 * fVar9 + auVar69._20_4_;
              auVar53._24_4_ = fVar2 * fVar10 + auVar69._24_4_;
              auVar53._28_4_ = fVar1 + auVar69._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar18 + lVar17);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar18 + lVar17 + 4);
              auVar49._0_4_ = fVar1 * fVar4 + auVar47._0_4_;
              auVar49._4_4_ = fVar1 * fVar5 + auVar47._4_4_;
              auVar49._8_4_ = fVar1 * fVar6 + auVar47._8_4_;
              auVar49._12_4_ = fVar1 * fVar7 + auVar47._12_4_;
              auVar49._16_4_ = fVar1 * fVar8 + auVar47._16_4_;
              auVar49._20_4_ = fVar1 * fVar9 + auVar47._20_4_;
              auVar49._24_4_ = fVar1 * fVar10 + auVar47._24_4_;
              auVar49._28_4_ = fVar1 + auVar47._28_4_;
              auVar43._0_4_ = fVar2 * fVar4 + auVar42._0_4_;
              auVar43._4_4_ = fVar2 * fVar5 + auVar42._4_4_;
              auVar43._8_4_ = fVar2 * fVar6 + auVar42._8_4_;
              auVar43._12_4_ = fVar2 * fVar7 + auVar42._12_4_;
              auVar43._16_4_ = fVar2 * fVar8 + auVar42._16_4_;
              auVar43._20_4_ = fVar2 * fVar9 + auVar42._20_4_;
              auVar43._24_4_ = fVar2 * fVar10 + auVar42._24_4_;
              auVar43._28_4_ = pfVar16[7] + auVar42._28_4_;
              lVar18 = lVar18 + 0x10;
              iVar38 = iVar38 + -1;
              auVar42 = auVar43;
              auVar69 = auVar53;
              auVar47 = auVar49;
              auVar65 = auVar57;
            } while (iVar38 != 0);
          }
          auVar61._16_16_ = auVar53._0_16_;
          auVar61._0_16_ = auVar57._0_16_;
          *pauVar31 = auVar61;
          auVar62._16_16_ = auVar43._0_16_;
          auVar62._0_16_ = auVar49._0_16_;
          pauVar31[1] = auVar62;
          auVar42 = vperm2f128_avx(auVar57,auVar53,0x31);
          *pauVar32 = auVar42;
          auVar42 = vperm2f128_avx(auVar49,auVar43,0x31);
          pauVar32[1] = auVar42;
          pauVar31 = pauVar31 + 2;
          pauVar32 = pauVar32 + 2;
          uVar27 = iVar37 + 4;
          uVar29 = (ulong)uVar27;
          uVar15 = (uint)(byte)((char)uVar15 + 1);
          uVar23 = (ulong)uVar27;
        } while (iVar37 + 7 < (int)uVar3);
      }
      else {
        uVar29 = uVar23 & 0xffffffff;
      }
      if ((int)uVar29 < (int)uVar3) {
        do {
          uVar15 = (uint)uVar29;
          auVar44 = *(undefined1 (*) [32])ppvVar25;
          if (0 < iVar33 * 8) {
            pfVar16 = (float *)(kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data);
            lVar17 = 0;
            auVar42 = auVar44;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ +
                                lVar17 * 4 +
                                local_88 * local_c8._16_8_ *
                                (ulong)((uVar15 & 3) + (int)(uVar29 >> 3) +
                                       (uint)((uVar15 >> 2 & 1) != 0)));
              auVar44._0_4_ = fVar1 * *pfVar16 + auVar42._0_4_;
              auVar44._4_4_ = fVar1 * pfVar16[1] + auVar42._4_4_;
              auVar44._8_4_ = fVar1 * pfVar16[2] + auVar42._8_4_;
              auVar44._12_4_ = fVar1 * pfVar16[3] + auVar42._12_4_;
              auVar44._16_4_ = fVar1 * pfVar16[4] + auVar42._16_4_;
              auVar44._20_4_ = fVar1 * pfVar16[5] + auVar42._20_4_;
              auVar44._24_4_ = fVar1 * pfVar16[6] + auVar42._24_4_;
              auVar44._28_4_ = fVar1 + auVar42._28_4_;
              pfVar16 = pfVar16 + 8;
              lVar17 = lVar17 + 1;
              auVar42 = auVar44;
            } while (iVar36 != (int)lVar17);
          }
          *(undefined1 (*) [16])*pauVar31 = auVar44._0_16_;
          *(undefined1 (*) [16])*pauVar32 = auVar44._16_16_;
          pauVar31 = (undefined1 (*) [32])((long)*pauVar31 + 0x10);
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
          uVar29 = (ulong)(uVar15 + 1);
        } while (uVar15 + 1 != uVar3);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_60);
  }
  uVar19 = local_80 & 0xfffffffffffffffe;
  if ((int)uVar19 != (int)local_80) {
    iVar21 = iVar21 * uVar28;
    iVar33 = iVar21 * 8;
    do {
      pauVar20 = (undefined1 (*) [16])
                 (local_70->cstep * uVar19 * local_70->elemsize + (long)local_70->data);
      ppvVar25 = &local_68->data + uVar19 * 2;
      if (local_68 == (Mat *)0x0) {
        ppvVar25 = &local_58;
      }
      local_58 = (void *)0x0;
      uStack_50 = 0;
      iVar36 = (int)uVar19;
      if ((int)uVar3 < 8) {
        uVar23 = 0;
      }
      else {
        uVar28 = ((uint)(uVar19 >> 0x1f) & 1) + iVar36;
        lVar17 = 0;
        uVar29 = 0;
        do {
          auVar68 = *(undefined1 (*) [16])ppvVar25;
          auVar66 = auVar68;
          auVar63 = auVar68;
          auVar58 = auVar68;
          auVar54 = auVar68;
          auVar50 = auVar68;
          auVar45 = auVar68;
          auVar39 = auVar68;
          if (0 < iVar21 * 8) {
            lVar18 = local_88 * local_c8._16_8_ * lVar17;
            lVar35 = 0;
            iVar37 = iVar33;
            auVar55 = auVar68;
            auVar51 = auVar68;
            auVar46 = auVar68;
            auVar40 = auVar68;
            auVar41 = auVar68;
            auVar12 = auVar68;
            auVar13 = auVar68;
            auVar14 = auVar68;
            do {
              pfVar16 = (float *)((long)kernel->data +
                                 lVar35 + kernel->cstep *
                                          (long)(int)(((int)uVar28 >> 1) +
                                                     (iVar36 - (uVar28 & 0xfffffffe))) *
                                          kernel->elemsize);
              fVar4 = *pfVar16;
              fVar5 = pfVar16[1];
              fVar6 = pfVar16[2];
              fVar7 = pfVar16[3];
              fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar35 * 2 + lVar18);
              fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar35 * 2 + lVar18 + 4);
              auVar68._0_4_ = fVar1 * fVar4 + auVar14._0_4_;
              auVar68._4_4_ = fVar1 * fVar5 + auVar14._4_4_;
              auVar68._8_4_ = fVar1 * fVar6 + auVar14._8_4_;
              auVar68._12_4_ = fVar1 * fVar7 + auVar14._12_4_;
              auVar66._0_4_ = fVar2 * fVar4 + auVar13._0_4_;
              auVar66._4_4_ = fVar2 * fVar5 + auVar13._4_4_;
              auVar66._8_4_ = fVar2 * fVar6 + auVar13._8_4_;
              auVar66._12_4_ = fVar2 * fVar7 + auVar13._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar35 * 2 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar35 * 2 + lVar18 + 4);
              auVar63._0_4_ = fVar1 * fVar4 + auVar12._0_4_;
              auVar63._4_4_ = fVar1 * fVar5 + auVar12._4_4_;
              auVar63._8_4_ = fVar1 * fVar6 + auVar12._8_4_;
              auVar63._12_4_ = fVar1 * fVar7 + auVar12._12_4_;
              auVar58._0_4_ = fVar2 * fVar4 + auVar41._0_4_;
              auVar58._4_4_ = fVar2 * fVar5 + auVar41._4_4_;
              auVar58._8_4_ = fVar2 * fVar6 + auVar41._8_4_;
              auVar58._12_4_ = fVar2 * fVar7 + auVar41._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar35 * 2 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar35 * 2 + lVar18 + 4);
              auVar54._0_4_ = fVar1 * fVar4 + auVar40._0_4_;
              auVar54._4_4_ = fVar1 * fVar5 + auVar40._4_4_;
              auVar54._8_4_ = fVar1 * fVar6 + auVar40._8_4_;
              auVar54._12_4_ = fVar1 * fVar7 + auVar40._12_4_;
              auVar50._0_4_ = fVar2 * fVar4 + auVar46._0_4_;
              auVar50._4_4_ = fVar2 * fVar5 + auVar46._4_4_;
              auVar50._8_4_ = fVar2 * fVar6 + auVar46._8_4_;
              auVar50._12_4_ = fVar2 * fVar7 + auVar46._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar35 * 2 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar35 * 2 + lVar18 + 4);
              auVar45._0_4_ = fVar1 * fVar4 + auVar51._0_4_;
              auVar45._4_4_ = fVar1 * fVar5 + auVar51._4_4_;
              auVar45._8_4_ = fVar1 * fVar6 + auVar51._8_4_;
              auVar45._12_4_ = fVar1 * fVar7 + auVar51._12_4_;
              auVar39._0_4_ = fVar2 * fVar4 + auVar55._0_4_;
              auVar39._4_4_ = fVar2 * fVar5 + auVar55._4_4_;
              auVar39._8_4_ = fVar2 * fVar6 + auVar55._8_4_;
              auVar39._12_4_ = fVar2 * fVar7 + auVar55._12_4_;
              lVar35 = lVar35 + 0x10;
              iVar37 = iVar37 + -1;
              auVar55 = auVar39;
              auVar51 = auVar45;
              auVar46 = auVar50;
              auVar40 = auVar54;
              auVar41 = auVar58;
              auVar12 = auVar63;
              auVar13 = auVar66;
              auVar14 = auVar68;
            } while (iVar37 != 0);
          }
          *pauVar20 = auVar68;
          pauVar20[1] = auVar66;
          pauVar20[2] = auVar63;
          pauVar20[3] = auVar58;
          pauVar20[4] = auVar54;
          pauVar20[5] = auVar50;
          pauVar20[6] = auVar45;
          pauVar20[7] = auVar39;
          pauVar20 = pauVar20 + 8;
          uVar23 = uVar29 + 8;
          lVar18 = uVar29 + 0xf;
          lVar17 = lVar17 + 1;
          uVar29 = uVar23;
        } while (lVar18 < lVar22);
      }
      if ((int)((uint)uVar23 | 3) < (int)uVar3) {
        uVar28 = ((uint)(uVar19 >> 0x1f) & 1) + iVar36;
        uVar15 = 0;
        do {
          auVar55 = *(undefined1 (*) [16])ppvVar25;
          iVar37 = (int)uVar23;
          auVar51 = auVar55;
          auVar46 = auVar55;
          auVar40 = auVar55;
          if (0 < iVar21 * 8) {
            lVar17 = local_88 * local_c8._16_8_ *
                     (ulong)((uVar15 & 1) + ((uint)(uVar23 >> 3) & 0x1fffffff));
            lVar18 = 0;
            iVar38 = iVar33;
            auVar68 = auVar55;
            auVar66 = auVar55;
            auVar63 = auVar55;
            auVar58 = auVar55;
            do {
              pfVar16 = (float *)((long)kernel->data +
                                 lVar18 + kernel->cstep *
                                          (long)(int)(((int)uVar28 >> 1) +
                                                     (iVar36 - (uVar28 & 0xfffffffe))) *
                                          kernel->elemsize);
              fVar4 = *pfVar16;
              fVar5 = pfVar16[1];
              fVar6 = pfVar16[2];
              fVar7 = pfVar16[3];
              fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar18 + lVar17);
              fVar2 = *(float *)((long)(_func_int ***)local_c8._0_8_ + lVar18 + lVar17 + 4);
              auVar55._0_4_ = fVar1 * fVar4 + auVar58._0_4_;
              auVar55._4_4_ = fVar1 * fVar5 + auVar58._4_4_;
              auVar55._8_4_ = fVar1 * fVar6 + auVar58._8_4_;
              auVar55._12_4_ = fVar1 * fVar7 + auVar58._12_4_;
              auVar51._0_4_ = fVar2 * fVar4 + auVar63._0_4_;
              auVar51._4_4_ = fVar2 * fVar5 + auVar63._4_4_;
              auVar51._8_4_ = fVar2 * fVar6 + auVar63._8_4_;
              auVar51._12_4_ = fVar2 * fVar7 + auVar63._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar18 + lVar17);
              fVar2 = *(float *)((long)&((Allocator *)(local_c8._0_8_ + 8))->_vptr_Allocator +
                                lVar18 + lVar17 + 4);
              auVar46._0_4_ = fVar1 * fVar4 + auVar66._0_4_;
              auVar46._4_4_ = fVar1 * fVar5 + auVar66._4_4_;
              auVar46._8_4_ = fVar1 * fVar6 + auVar66._8_4_;
              auVar46._12_4_ = fVar1 * fVar7 + auVar66._12_4_;
              auVar40._0_4_ = fVar2 * fVar4 + auVar68._0_4_;
              auVar40._4_4_ = fVar2 * fVar5 + auVar68._4_4_;
              auVar40._8_4_ = fVar2 * fVar6 + auVar68._8_4_;
              auVar40._12_4_ = fVar2 * fVar7 + auVar68._12_4_;
              lVar18 = lVar18 + 0x10;
              iVar38 = iVar38 + -1;
              auVar68 = auVar40;
              auVar66 = auVar46;
              auVar63 = auVar51;
              auVar58 = auVar55;
            } while (iVar38 != 0);
          }
          *pauVar20 = auVar55;
          pauVar20[1] = auVar51;
          pauVar20[2] = auVar46;
          pauVar20[3] = auVar40;
          pauVar20 = pauVar20 + 4;
          uVar23 = (ulong)(iVar37 + 4);
          uVar15 = (uint)(byte)((char)uVar15 + 1);
        } while (iVar37 + 7 < (int)uVar3);
      }
      else {
        uVar23 = uVar23 & 0xffffffff;
      }
      if ((int)uVar23 < (int)local_78) {
        uVar28 = ((uint)(uVar19 >> 0x1f) & 1) + iVar36;
        do {
          uVar15 = (uint)uVar23;
          auVar41 = *(undefined1 (*) [16])ppvVar25;
          if (0 < iVar21 * 8) {
            pfVar16 = (float *)(kernel->cstep *
                                (long)(int)(((int)uVar28 >> 1) + (iVar36 - (uVar28 & 0xfffffffe))) *
                                kernel->elemsize + (long)kernel->data);
            lVar17 = 0;
            auVar68 = auVar41;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_c8._0_8_ +
                                lVar17 * 4 +
                                local_88 * local_c8._16_8_ *
                                (ulong)((uVar15 & 3) + (int)(uVar23 >> 3) +
                                       (uint)((uVar15 >> 2 & 1) != 0)));
              auVar41._0_4_ = fVar1 * *pfVar16 + auVar68._0_4_;
              auVar41._4_4_ = fVar1 * pfVar16[1] + auVar68._4_4_;
              auVar41._8_4_ = fVar1 * pfVar16[2] + auVar68._8_4_;
              auVar41._12_4_ = fVar1 * pfVar16[3] + auVar68._12_4_;
              pfVar16 = pfVar16 + 4;
              lVar17 = lVar17 + 1;
              auVar68 = auVar41;
            } while (iVar33 != (int)lVar17);
          }
          *pauVar20 = auVar41;
          pauVar20 = pauVar20 + 1;
          uVar23 = (ulong)(uVar15 + 1);
        } while (uVar15 + 1 != uVar3);
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)local_80);
  }
  piVar11 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_c8._0_8_ != (Allocator *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 32u, 8, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 32u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 32u, 8, opt.workspace_allocator);
    {
        int nn_size = size / 8;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x4
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                    _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);

                    img0 += size * 8;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum0, 0));
            _mm_store_ps(outptr0 + 4, _mm256_extractf128_ps(_sum1, 0));
            _mm_store_ps(outptr0 + 8, _mm256_extractf128_ps(_sum2, 0));
            _mm_store_ps(outptr0 + 12, _mm256_extractf128_ps(_sum3, 0));
            _mm_store_ps(outptr0 + 16, _mm256_extractf128_ps(_sum4, 0));
            _mm_store_ps(outptr0 + 20, _mm256_extractf128_ps(_sum5, 0));
            _mm_store_ps(outptr0 + 24, _mm256_extractf128_ps(_sum6, 0));
            _mm_store_ps(outptr0 + 28, _mm256_extractf128_ps(_sum7, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum0, 1));
            _mm_store_ps(outptr1 + 4, _mm256_extractf128_ps(_sum1, 1));
            _mm_store_ps(outptr1 + 8, _mm256_extractf128_ps(_sum2, 1));
            _mm_store_ps(outptr1 + 12, _mm256_extractf128_ps(_sum3, 1));
            _mm_store_ps(outptr1 + 16, _mm256_extractf128_ps(_sum4, 1));
            _mm_store_ps(outptr1 + 20, _mm256_extractf128_ps(_sum5, 1));
            _mm_store_ps(outptr1 + 24, _mm256_extractf128_ps(_sum6, 1));
            _mm_store_ps(outptr1 + 28, _mm256_extractf128_ps(_sum7, 1));

            outptr0 += 32;
            outptr1 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum0, 0));
            _mm_store_ps(outptr0 + 4, _mm256_extractf128_ps(_sum1, 0));
            _mm_store_ps(outptr0 + 8, _mm256_extractf128_ps(_sum2, 0));
            _mm_store_ps(outptr0 + 12, _mm256_extractf128_ps(_sum3, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum0, 1));
            _mm_store_ps(outptr1 + 4, _mm256_extractf128_ps(_sum1, 1));
            _mm_store_ps(outptr1 + 8, _mm256_extractf128_ps(_sum2, 1));
            _mm_store_ps(outptr1 + 12, _mm256_extractf128_ps(_sum3, 1));

            outptr0 += 16;
            outptr1 += 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum, 1));

            outptr0 += 4;
            outptr1 += 4;
        }
    }

    remain_outch_start += nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);

            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);

            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);
                __m128 _val0 = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum);

            outptr0 += 4;
        }
    }
}